

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

void __thiscall bssl::DTLSReplayBitmap::Record(DTLSReplayBitmap *this,uint64_t seq_num)

{
  _WordT *p_Var1;
  ulong uVar2;
  size_t __position;
  
  uVar2 = this->max_seq_num_;
  __position = seq_num - uVar2;
  if (uVar2 <= seq_num && __position != 0) {
    if (__position < 0x100) {
      std::bitset<256UL>::operator<<=(&this->map_,__position);
    }
    else {
      (this->map_).super__Base_bitset<4UL>._M_w[2] = 0;
      (this->map_).super__Base_bitset<4UL>._M_w[3] = 0;
      (this->map_).super__Base_bitset<4UL>._M_w[0] = 0;
      (this->map_).super__Base_bitset<4UL>._M_w[1] = 0;
    }
    this->max_seq_num_ = seq_num;
    uVar2 = seq_num;
  }
  uVar2 = uVar2 - seq_num;
  if (uVar2 < 0x100) {
    p_Var1 = (this->map_).super__Base_bitset<4UL>._M_w + (uVar2 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)uVar2 & 0x3f);
  }
  return;
}

Assistant:

void DTLSReplayBitmap::Record(uint64_t seq_num) {
  const size_t kWindowSize = map_.size();

  // Shift the window if necessary.
  if (seq_num > max_seq_num_) {
    uint64_t shift = seq_num - max_seq_num_;
    if (shift >= kWindowSize) {
      map_.reset();
    } else {
      map_ <<= shift;
    }
    max_seq_num_ = seq_num;
  }

  uint64_t idx = max_seq_num_ - seq_num;
  if (idx < kWindowSize) {
    map_[idx] = true;
  }
}